

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

cbtScalar gjkepa2_impl::GJK::projectorigin
                    (cbtVector3 *a,cbtVector3 *b,cbtVector3 *c,cbtScalar *w,U *m)

{
  uint uVar1;
  cbtVector3 *a_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  long lVar8;
  cbtScalar cVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  U subm;
  cbtScalar subw [2];
  cbtVector3 *vt [3];
  cbtVector3 dl [3];
  U local_12c;
  cbtScalar local_128 [3];
  float local_11c;
  uint local_118;
  float local_114;
  uint local_110;
  float local_10c;
  U *local_108;
  cbtVector3 *local_100;
  cbtVector3 *local_f8;
  cbtVector3 *local_f0;
  cbtVector3 *local_e8 [4];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [4];
  float afStack_84 [3];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  local_e8[0] = a;
  local_e8[1] = b;
  local_e8[2] = c;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)a->m_floats;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)b->m_floats;
  auVar3 = vsubps_avx(auVar11,auVar13);
  fVar10 = a->m_floats[2] - b->m_floats[2];
  _local_88 = vinsertps_avx(auVar3,ZEXT416((uint)fVar10),0x28);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)c->m_floats;
  auVar13 = vsubps_avx(auVar13,auVar19);
  local_98 = vsubps_avx(auVar19,auVar11);
  auVar12._16_16_ = local_98;
  auVar12._0_16_ = auVar13;
  local_58 = ZEXT1632(auVar13);
  fVar4 = b->m_floats[2] - c->m_floats[2];
  fVar16 = c->m_floats[2] - a->m_floats[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar17 = SUB1612(auVar2 << 0x40,4);
  auVar15._20_12_ = auVar17;
  auVar15._16_4_ = fVar4;
  local_a8 = ZEXT416((uint)fVar16);
  auVar14._20_12_ = auVar17;
  auVar14._16_4_ = fVar16;
  local_b8 = ZEXT416((uint)fVar4);
  auVar15._0_16_ = auVar13;
  auVar14._0_16_ = auVar13;
  auVar14 = vperm2f128_avx(auVar15,auVar14,0x31);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * auVar3._0_4_)),auVar13,ZEXT416((uint)fVar10));
  auVar21 = ZEXT1664(auVar11);
  local_78 = vunpcklpd_avx(auVar12,auVar14);
  local_c8 = vmovshdup_avx(auVar13);
  auVar2 = vmovshdup_avx(auVar3);
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(local_c8._0_4_ * fVar10)),auVar2,ZEXT416((uint)fVar4));
  auVar20 = ZEXT1664(auVar19);
  local_114 = auVar11._0_4_;
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar2._0_4_)),local_c8,auVar3);
  auVar18 = ZEXT1664(auVar3);
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(local_114 * local_114)),auVar19,auVar19);
  auVar2 = vfmadd231ss_fma(auVar2,auVar3,auVar3);
  local_11c = auVar2._0_4_;
  if (local_11c <= 0.0) {
    local_10c = -1.0;
  }
  else {
    local_10c = -1.0;
    lVar8 = 0;
    uVar7 = 0;
    local_110 = auVar19._0_4_;
    local_118 = auVar3._0_4_;
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_12c = 0;
    local_108 = m;
    local_100 = a;
    local_f8 = b;
    local_f0 = c;
    do {
      a_00 = *(cbtVector3 **)((long)local_e8 + lVar8 * 2);
      auVar2 = vfmsub231ss_fma(ZEXT416((uint)(auVar18._0_4_ * *(float *)(local_88 + lVar8 * 4))),
                               auVar20._0_16_,ZEXT416((uint)*(float *)(local_88 + lVar8 * 4 + 8)));
      auVar3 = vfmsub231ss_fma(ZEXT416((uint)(auVar21._0_4_ * *(float *)(local_88 + lVar8 * 4 + 8)))
                               ,ZEXT416((uint)*(float *)(local_88 + lVar8 * 4 + 4)),auVar18._0_16_);
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * a_00->m_floats[1])),auVar3,
                               ZEXT416((uint)a_00->m_floats[0]));
      auVar3 = vfmsub231ss_fma(ZEXT416((uint)(auVar20._0_4_ * *(float *)(local_88 + lVar8 * 4 + 4)))
                               ,auVar21._0_16_,ZEXT416((uint)*(float *)(local_88 + lVar8 * 4)));
      auVar2 = vfmadd231ss_fma(auVar2,auVar3,ZEXT416((uint)a_00->m_floats[2]));
      if (0.0 < auVar2._0_4_) {
        uVar1 = *(uint *)((long)projectorigin::imd3 + lVar8);
        cVar9 = projectorigin(a_00,local_e8[uVar1],local_128,&local_12c);
        auVar18 = ZEXT464(local_118);
        auVar21 = ZEXT464((uint)local_114);
        auVar20 = ZEXT464(local_110);
        if ((local_10c < 0.0) || (cVar9 < local_10c)) {
          *local_108 = (1 << (uVar1 & 0x1f) & (int)(local_12c << 0x1e) >> 0x1f) +
                       (1 << (uVar7 & 0x1f) & -(local_12c & 1));
          *(cbtScalar *)((long)w + lVar8) = local_128[0];
          w[uVar1] = local_128[1];
          w[projectorigin::imd3[uVar1]] = 0.0;
          local_10c = cVar9;
        }
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0xc);
    if (local_10c < 0.0) {
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * local_100->m_floats[1])),
                               auVar20._0_16_,ZEXT416((uint)local_100->m_floats[0]));
      auVar2 = vfmadd231ss_fma(auVar2,auVar18._0_16_,ZEXT416((uint)local_100->m_floats[2]));
      *local_108 = 7;
      auVar3 = vsqrtss_avx(ZEXT416((uint)local_11c),ZEXT416((uint)local_11c));
      local_11c = auVar2._0_4_ / local_11c;
      fVar10 = auVar20._0_4_ * local_11c;
      fVar4 = auVar21._0_4_ * local_11c;
      local_11c = auVar18._0_4_ * local_11c;
      fVar16 = local_f8->m_floats[0] - fVar10;
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar4)),ZEXT416((uint)fVar10),
                               ZEXT416((uint)fVar10));
      fVar5 = local_f8->m_floats[1] - fVar4;
      fVar6 = local_f8->m_floats[2] - local_11c;
      auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)local_11c),ZEXT416((uint)local_11c));
      local_10c = auVar2._0_4_;
      auVar2 = vfmsub231ss_fma(ZEXT416((uint)(local_b8._0_4_ * fVar5)),local_c8,ZEXT416((uint)fVar6)
                              );
      auVar13 = vfmsub231ss_fma(ZEXT416((uint)(local_58._0_4_ * fVar6)),ZEXT416((uint)fVar16),
                                local_b8);
      auVar11 = vfmsub231ss_fma(ZEXT416((uint)(local_c8._0_4_ * fVar16)),local_58._0_16_,
                                ZEXT416((uint)fVar5));
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_)),auVar2,auVar2);
      auVar2 = vfmadd231ss_fma(auVar2,auVar11,auVar11);
      auVar2 = vsqrtss_avx(auVar2,auVar2);
      fVar16 = auVar2._0_4_ / auVar3._0_4_;
      *w = fVar16;
      fVar4 = local_f0->m_floats[1] - fVar4;
      fVar10 = local_f0->m_floats[0] - fVar10;
      local_11c = local_f0->m_floats[2] - local_11c;
      auVar2 = vmovshdup_avx(local_98);
      auVar13 = vfmsub231ss_fma(ZEXT416((uint)(local_a8._0_4_ * fVar4)),auVar2,
                                ZEXT416((uint)local_11c));
      auVar11 = vfmsub231ss_fma(ZEXT416((uint)(local_11c * local_98._0_4_)),ZEXT416((uint)fVar10),
                                local_a8);
      auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * auVar2._0_4_)),local_98,ZEXT416((uint)fVar4)
                               );
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar11._0_4_)),auVar13,auVar13);
      auVar2 = vfmadd231ss_fma(auVar2,auVar19,auVar19);
      auVar2 = vsqrtss_avx(auVar2,auVar2);
      fVar10 = auVar2._0_4_ / auVar3._0_4_;
      w[1] = fVar10;
      w[2] = 1.0 - (fVar16 + fVar10);
    }
  }
  return local_10c;
}

Assistant:

static cbtScalar projectorigin(const cbtVector3& a,
								  const cbtVector3& b,
								  const cbtVector3& c,
								  cbtScalar* w, U& m)
	{
		static const U imd3[] = {1, 2, 0};
		const cbtVector3* vt[] = {&a, &b, &c};
		const cbtVector3 dl[] = {a - b, b - c, c - a};
		const cbtVector3 n = cbtCross(dl[0], dl[1]);
		const cbtScalar l = n.length2();
		if (l > GJK_SIMPLEX3_EPS)
		{
			cbtScalar mindist = -1;
			cbtScalar subw[2] = {0.f, 0.f};
			U subm(0);
			for (U i = 0; i < 3; ++i)
			{
				if (cbtDot(*vt[i], cbtCross(dl[i], n)) > 0)
				{
					const U j = imd3[i];
					const cbtScalar subd(projectorigin(*vt[i], *vt[j], subw, subm));
					if ((mindist < 0) || (subd < mindist))
					{
						mindist = subd;
						m = static_cast<U>(((subm & 1) ? 1 << i : 0) + ((subm & 2) ? 1 << j : 0));
						w[i] = subw[0];
						w[j] = subw[1];
						w[imd3[j]] = 0;
					}
				}
			}
			if (mindist < 0)
			{
				const cbtScalar d = cbtDot(a, n);
				const cbtScalar s = cbtSqrt(l);
				const cbtVector3 p = n * (d / l);
				mindist = p.length2();
				m = 7;
				w[0] = (cbtCross(dl[1], b - p)).length() / s;
				w[1] = (cbtCross(dl[2], c - p)).length() / s;
				w[2] = 1 - (w[0] + w[1]);
			}
			return (mindist);
		}
		return (-1);
	}